

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.hpp
# Opt level: O1

functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_> * __thiscall
ising::free_energy::triangular::(anonymous_namespace)::
func<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
          (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,double Ja,double Jb,double Jc,
          fvar<double,_2UL> beta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  size_t i_4;
  fvar<double,_2UL> *pfVar9;
  long lVar10;
  size_t i_2;
  double *pdVar11;
  double *pdVar12;
  fvar<double,_2UL> *in_RDX;
  size_t i;
  fvar<double,_2UL> *cr;
  fvar<double,_2UL> *cr_00;
  fvar<double,_2UL> *cr_01;
  fvar<double,_2UL> *cr_02;
  long lVar13;
  size_t i_1;
  long lVar14;
  fvar<double,_2UL> *pfVar15;
  double *pdVar16;
  bool bVar17;
  double dVar18;
  fvar<double,_2UL> retval;
  fvar<double,_2UL> retval_6;
  fvar<double,_2UL> retval_4;
  fvar<double,_2UL> retval_3;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval_8;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval_9;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval_5;
  double local_150;
  undefined1 local_148 [16];
  fvar<double,_2UL> local_138;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  undefined1 local_100 [16];
  double local_f0;
  undefined1 local_e8 [16];
  double local_d8;
  undefined1 local_d0 [16];
  double local_c0 [6];
  double local_90 [3];
  fvar<double,_2UL> local_78;
  fvar<double,_2UL> local_60;
  double local_48 [3];
  
  __return_storage_ptr__->c_ = 0.012665147955292222;
  auVar7._8_8_ = -(ulong)(beta.v._M_elems[2] != 0.0);
  auVar7._0_8_ = -(ulong)(beta.v._M_elems[1] != 0.0);
  uVar8 = movmskpd(0x6222c720,auVar7);
  local_138.v._M_elems[1] = beta.v._M_elems[1];
  if ((uVar8 & 1) != 0) {
    local_138.v._M_elems[1] = beta.v._M_elems[1] + beta.v._M_elems[1];
  }
  local_138.v._M_elems[2] = beta.v._M_elems[2];
  if ((uVar8 & 2) != 0) {
    local_138.v._M_elems[2] = beta.v._M_elems[2] + beta.v._M_elems[2];
  }
  local_138.v._M_elems[0] = (beta.v._M_elems[0] + beta.v._M_elems[0]) * Ja;
  if ((local_138.v._M_elems[1] != 0.0) || (NAN(local_138.v._M_elems[1]))) {
    local_138.v._M_elems[1] = local_138.v._M_elems[1] * Ja;
  }
  if (local_138.v._M_elems[2] != 0.0) {
    local_138.v._M_elems[2] = local_138.v._M_elems[2] * Ja;
  }
  pfVar15 = &__return_storage_ptr__->sh2a_;
  local_120 = Ja;
  local_118 = Jb;
  local_110 = Jc;
  pfVar9 = boost::math::differentiation::autodiff_v1::detail::sinh<double,2ul>
                     (pfVar15,(detail *)&local_138,in_RDX);
  auVar1._8_4_ = (int)-(ulong)(beta.v._M_elems[2] != 0.0);
  auVar1._0_8_ = -(ulong)(beta.v._M_elems[1] != 0.0);
  auVar1._12_4_ = (int)(-(ulong)(beta.v._M_elems[2] != 0.0) >> 0x20);
  uVar8 = movmskpd((int)pfVar9,auVar1);
  dVar6 = beta.v._M_elems[1];
  if ((uVar8 & 1) != 0) {
    dVar6 = beta.v._M_elems[1] + beta.v._M_elems[1];
  }
  dVar18 = beta.v._M_elems[2];
  if ((uVar8 & 2) != 0) {
    dVar18 = beta.v._M_elems[2] + beta.v._M_elems[2];
  }
  local_148._8_4_ = SUB84(dVar18,0);
  local_148._0_8_ = dVar6;
  local_148._12_4_ = (int)((ulong)dVar18 >> 0x20);
  local_150 = (beta.v._M_elems[0] + beta.v._M_elems[0]) * local_118;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_148._0_8_ = dVar6 * local_118;
  }
  if (dVar18 != 0.0) {
    local_148._8_8_ = dVar18 * local_118;
  }
  boost::math::differentiation::autodiff_v1::detail::sinh<double,2ul>
            (&local_138,(detail *)&local_150,cr);
  (__return_storage_ptr__->sh2b_).v._M_elems[2] = local_138.v._M_elems[2];
  (__return_storage_ptr__->sh2b_).v._M_elems[0] = local_138.v._M_elems[0];
  (__return_storage_ptr__->sh2b_).v._M_elems[1] = local_138.v._M_elems[1];
  auVar2._8_4_ = (int)-(ulong)(beta.v._M_elems[2] != 0.0);
  auVar2._0_8_ = -(ulong)(beta.v._M_elems[1] != 0.0);
  auVar2._12_4_ = (int)(-(ulong)(beta.v._M_elems[2] != 0.0) >> 0x20);
  uVar8 = movmskpd(SUB84(local_138.v._M_elems[2],0),auVar2);
  dVar6 = beta.v._M_elems[1];
  if ((uVar8 & 1) != 0) {
    dVar6 = beta.v._M_elems[1] + beta.v._M_elems[1];
  }
  dVar18 = beta.v._M_elems[2];
  if ((uVar8 & 2) != 0) {
    dVar18 = beta.v._M_elems[2] + beta.v._M_elems[2];
  }
  local_148._8_4_ = SUB84(dVar18,0);
  local_148._0_8_ = dVar6;
  local_148._12_4_ = (int)((ulong)dVar18 >> 0x20);
  local_150 = (beta.v._M_elems[0] + beta.v._M_elems[0]) * local_110;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_148._0_8_ = dVar6 * local_110;
  }
  if (dVar18 != 0.0) {
    local_148._8_8_ = dVar18 * local_110;
  }
  boost::math::differentiation::autodiff_v1::detail::sinh<double,2ul>
            (&local_138,(detail *)&local_150,cr_00);
  (__return_storage_ptr__->sh2c_).v._M_elems[2] = local_138.v._M_elems[2];
  (__return_storage_ptr__->sh2c_).v._M_elems[0] = local_138.v._M_elems[0];
  (__return_storage_ptr__->sh2c_).v._M_elems[1] = local_138.v._M_elems[1];
  auVar3._8_4_ = (int)-(ulong)(beta.v._M_elems[2] != 0.0);
  auVar3._0_8_ = -(ulong)(beta.v._M_elems[1] != 0.0);
  auVar3._12_4_ = (int)(-(ulong)(beta.v._M_elems[2] != 0.0) >> 0x20);
  uVar8 = movmskpd(SUB84(local_138.v._M_elems[2],0),auVar3);
  dVar6 = beta.v._M_elems[1];
  if ((uVar8 & 1) != 0) {
    dVar6 = beta.v._M_elems[1] + beta.v._M_elems[1];
  }
  dVar18 = beta.v._M_elems[2];
  if ((uVar8 & 2) != 0) {
    dVar18 = beta.v._M_elems[2] + beta.v._M_elems[2];
  }
  local_d0._8_4_ = SUB84(dVar18,0);
  local_d0._0_8_ = dVar6;
  local_d0._12_4_ = (int)((ulong)dVar18 >> 0x20);
  local_d8 = (beta.v._M_elems[0] + beta.v._M_elems[0]) * local_120;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_d0._0_8_ = dVar6 * local_120;
  }
  if (dVar18 != 0.0) {
    local_d0._8_8_ = dVar18 * local_120;
  }
  pdVar12 = local_48;
  pfVar9 = boost::math::differentiation::autodiff_v1::detail::cosh<double,2ul>
                     ((fvar<double,_2UL> *)pdVar12,(detail *)&local_d8,cr_01);
  auVar4._8_4_ = (int)-(ulong)(beta.v._M_elems[2] != 0.0);
  auVar4._0_8_ = -(ulong)(beta.v._M_elems[1] != 0.0);
  auVar4._12_4_ = (int)(-(ulong)(beta.v._M_elems[2] != 0.0) >> 0x20);
  uVar8 = movmskpd((int)pfVar9,auVar4);
  dVar6 = beta.v._M_elems[1];
  if ((uVar8 & 1) != 0) {
    dVar6 = beta.v._M_elems[1] + beta.v._M_elems[1];
  }
  dVar18 = beta.v._M_elems[2];
  if ((uVar8 & 2) != 0) {
    dVar18 = beta.v._M_elems[2] + beta.v._M_elems[2];
  }
  local_e8._8_4_ = SUB84(dVar18,0);
  local_e8._0_8_ = dVar6;
  local_e8._12_4_ = (int)((ulong)dVar18 >> 0x20);
  local_f0 = (beta.v._M_elems[0] + beta.v._M_elems[0]) * local_118;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_e8._0_8_ = dVar6 * local_118;
  }
  if (dVar18 != 0.0) {
    local_e8._8_8_ = dVar18 * local_118;
  }
  boost::math::differentiation::autodiff_v1::detail::cosh<double,2ul>
            (&local_78,(detail *)&local_f0,cr_02);
  lVar10 = 2;
  lVar13 = 0;
  do {
    if ((fvar<double,_2UL> *)((long)&local_60 + lVar10 * -8) == &local_78) {
      dVar6 = 0.0;
    }
    else {
      dVar6 = 0.0;
      lVar14 = 0;
      pdVar11 = (double *)&local_78;
      do {
        dVar6 = dVar6 + *pdVar11 * *(double *)((long)pdVar12 + lVar14);
        pdVar11 = pdVar11 + 1;
        lVar14 = lVar14 + -8;
      } while (lVar10 * 8 + -0x18 != lVar14);
    }
    local_60.v._M_elems[lVar13] = dVar6;
    lVar13 = lVar13 + 1;
    bVar17 = lVar10 == 0;
    lVar10 = lVar10 + -1;
    if (bVar17) {
      lVar10 = 0;
    }
    pdVar12 = pdVar12 + 1;
  } while (lVar13 != 3);
  auVar5._8_4_ = (int)-(ulong)(beta.v._M_elems[2] != 0.0);
  auVar5._0_8_ = -(ulong)(beta.v._M_elems[1] != 0.0);
  auVar5._12_4_ = (int)(-(ulong)(beta.v._M_elems[2] != 0.0) >> 0x20);
  uVar8 = movmskpd((int)&beta,auVar5);
  dVar6 = beta.v._M_elems[1];
  if ((uVar8 & 1) != 0) {
    dVar6 = beta.v._M_elems[1] + beta.v._M_elems[1];
  }
  dVar18 = beta.v._M_elems[2];
  if ((uVar8 & 2) != 0) {
    dVar18 = beta.v._M_elems[2] + beta.v._M_elems[2];
  }
  local_100._8_4_ = SUB84(dVar18,0);
  local_100._0_8_ = dVar6;
  local_100._12_4_ = (int)((ulong)dVar18 >> 0x20);
  local_108 = (beta.v._M_elems[0] + beta.v._M_elems[0]) * local_110;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_100._0_8_ = dVar6 * local_110;
  }
  if (dVar18 != 0.0) {
    local_100._8_8_ = dVar18 * local_110;
  }
  pdVar12 = local_c0 + 6;
  boost::math::differentiation::autodiff_v1::detail::cosh<double,2ul>
            ((fvar<double,_2UL> *)pdVar12,(detail *)&local_108,(fvar<double,_2UL> *)0x3);
  lVar10 = 2;
  pdVar11 = (double *)&local_60;
  lVar13 = 0;
  do {
    if ((fvar<double,_2UL> *)((long)&local_78 + lVar10 * -8) == (fvar<double,_2UL> *)pdVar12) {
      dVar6 = 0.0;
    }
    else {
      dVar6 = 0.0;
      lVar14 = 0;
      pdVar16 = pdVar12;
      do {
        dVar6 = dVar6 + *pdVar16 * *(double *)((long)pdVar11 + lVar14);
        pdVar16 = pdVar16 + 1;
        lVar14 = lVar14 + -8;
      } while (lVar10 * 8 + -0x18 != lVar14);
    }
    *(double *)(local_148 + lVar13 * 8 + -8) = dVar6;
    lVar13 = lVar13 + 1;
    bVar17 = lVar10 == 0;
    lVar10 = lVar10 + -1;
    if (bVar17) {
      lVar10 = 0;
    }
    pdVar11 = pdVar11 + 1;
  } while (lVar13 != 3);
  lVar10 = 2;
  lVar13 = 0;
  do {
    dVar6 = 0.0;
    lVar14 = 0;
    pfVar9 = &__return_storage_ptr__->sh2b_;
    do {
      dVar6 = dVar6 + (pfVar9->v)._M_elems[0] * *(double *)((long)(pfVar15->v)._M_elems + lVar14);
      pfVar9 = (fvar<double,_2UL> *)((pfVar9->v)._M_elems + 1);
      lVar14 = lVar14 + -8;
    } while (lVar10 * 8 + -0x18 != lVar14);
    local_c0[lVar13] = dVar6;
    lVar13 = lVar13 + 1;
    bVar17 = lVar10 == 0;
    lVar10 = lVar10 + -1;
    if (bVar17) {
      lVar10 = 0;
    }
    pfVar15 = (fvar<double,_2UL> *)((pfVar15->v)._M_elems + 1);
  } while (lVar13 != 3);
  lVar10 = 2;
  pdVar12 = local_c0;
  lVar13 = 0;
  do {
    dVar6 = 0.0;
    lVar14 = 0;
    pfVar15 = &__return_storage_ptr__->sh2c_;
    do {
      dVar6 = dVar6 + (pfVar15->v)._M_elems[0] * *(double *)((long)pdVar12 + lVar14);
      pfVar15 = (fvar<double,_2UL> *)((pfVar15->v)._M_elems + 1);
      lVar14 = lVar14 + -8;
    } while (lVar10 * 8 + -0x18 != lVar14);
    local_c0[lVar13 + 3] = dVar6;
    lVar13 = lVar13 + 1;
    bVar17 = lVar10 == 0;
    lVar10 = lVar10 + -1;
    if (bVar17) {
      lVar10 = 0;
    }
    pdVar12 = pdVar12 + 1;
  } while (lVar13 != 3);
  lVar10 = 0;
  do {
    local_138.v._M_elems[lVar10] = *(double *)(local_148 + lVar10 * 8 + -8) + local_c0[lVar10 + 3];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  (__return_storage_ptr__->cshabc_).v._M_elems[2] = local_138.v._M_elems[2];
  (__return_storage_ptr__->cshabc_).v._M_elems[0] = local_138.v._M_elems[0];
  (__return_storage_ptr__->cshabc_).v._M_elems[1] = local_138.v._M_elems[1];
  return __return_storage_ptr__;
}

Assistant:

functor<T, FVAR> func(T Ja, T Jb, T Jc, FVAR beta) {
  return functor<T, FVAR>(Ja, Jb, Jc, beta);
}